

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.hpp
# Opt level: O1

void __thiscall duckdb::SecretManager::SecretManager(SecretManager *this)

{
  this->_vptr_SecretManager = (_func_int **)&PTR__SecretManager_024a5d40;
  (this->manager_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->manager_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->manager_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->manager_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->manager_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->secret_functions)._M_h._M_buckets = &(this->secret_functions)._M_h._M_single_bucket;
  (this->secret_functions)._M_h._M_bucket_count = 1;
  (this->secret_functions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->secret_functions)._M_h._M_element_count = 0;
  (this->secret_functions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->secret_functions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->secret_functions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->secret_types)._M_h._M_buckets = &(this->secret_types)._M_h._M_single_bucket;
  (this->secret_types)._M_h._M_bucket_count = 1;
  (this->secret_types)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->secret_types)._M_h._M_element_count = 0;
  (this->secret_types)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->secret_types)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->secret_types)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->secret_storages)._M_h._M_buckets = &(this->secret_storages)._M_h._M_single_bucket;
  (this->secret_storages)._M_h._M_bucket_count = 1;
  (this->secret_storages)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->secret_storages)._M_h._M_element_count = 0;
  (this->secret_storages)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->initialized)._M_base._M_i = false;
  (this->secret_storages)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->secret_storages)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->config).default_persist_type = TEMPORARY;
  (this->config).secret_path._M_dataplus._M_p = (pointer)&(this->config).secret_path.field_2;
  (this->config).secret_path._M_string_length = 0;
  (this->config).secret_path.field_2._M_local_buf[0] = '\0';
  (this->config).default_secret_path._M_dataplus._M_p =
       (pointer)&(this->config).default_secret_path.field_2;
  (this->config).default_secret_path._M_string_length = 0;
  (this->config).default_secret_path.field_2._M_local_buf[0] = '\0';
  (this->config).default_persistent_storage._M_dataplus._M_p =
       (pointer)&(this->config).default_persistent_storage.field_2;
  (this->config).default_persistent_storage._M_string_length = 0;
  (this->config).default_persistent_storage.field_2._M_local_buf[0] = '\0';
  (this->config).allow_persistent_secrets = true;
  (this->db).ptr = (DatabaseInstance *)0x0;
  return;
}

Assistant:

explicit SecretManager() = default;